

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.c
# Opt level: O1

void index_tree_append(index_tree *tree,index_tree_node *node)

{
  index_tree_node *piVar1;
  index_tree_node *piVar2;
  uint uVar3;
  int iVar4;
  
  piVar1 = tree->rightmost;
  node->parent = piVar1;
  node->left = (index_tree_node *)0x0;
  node->right = (index_tree_node *)0x0;
  uVar3 = tree->count + 1;
  tree->count = uVar3;
  if (tree->root == (index_tree_node *)0x0) {
    tree->root = node;
    tree->leftmost = node;
    tree->rightmost = node;
  }
  else {
    if (node->uncompressed_base < piVar1->uncompressed_base) {
      __assert_fail("tree->rightmost->uncompressed_base <= node->uncompressed_base",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/common/index.c"
                    ,0xf7,"void index_tree_append(index_tree *, index_tree_node *)");
    }
    if (node->compressed_base <= piVar1->compressed_base) {
      __assert_fail("tree->rightmost->compressed_base < node->compressed_base",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/common/index.c"
                    ,0xf8,"void index_tree_append(index_tree *, index_tree_node *)");
    }
    piVar1->right = node;
    tree->rightmost = node;
    iVar4 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar4 == 0; iVar4 = iVar4 + -1) {
      }
    }
    if (uVar3 != 1 << ((byte)iVar4 & 0x1f)) {
      iVar4 = 0;
      if (uVar3 != 0) {
        for (; (uVar3 >> iVar4 & 1) == 0; iVar4 = iVar4 + 1) {
        }
      }
      iVar4 = iVar4 + 2;
      do {
        node = node->parent;
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
      piVar1 = node->parent;
      piVar2 = node->right;
      if (piVar1 != (index_tree_node *)0x0) {
        if (piVar1->right != node) {
          __assert_fail("node->parent->right == node",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/common/index.c"
                        ,0x115,"void index_tree_append(index_tree *, index_tree_node *)");
        }
        tree = (index_tree *)&piVar1->right;
      }
      tree->root = piVar2;
      piVar2->parent = piVar1;
      piVar1 = piVar2->left;
      node->right = piVar1;
      if (piVar1 != (index_tree_node *)0x0) {
        piVar1->parent = node;
      }
      piVar2->left = node;
      node->parent = piVar2;
    }
  }
  return;
}

Assistant:

static void
index_tree_append(index_tree *tree, index_tree_node *node)
{
	node->parent = tree->rightmost;
	node->left = NULL;
	node->right = NULL;

	++tree->count;

	// Handle the special case of adding the first node.
	if (tree->root == NULL) {
		tree->root = node;
		tree->leftmost = node;
		tree->rightmost = node;
		return;
	}

	// The tree is always filled sequentially.
	assert(tree->rightmost->uncompressed_base <= node->uncompressed_base);
	assert(tree->rightmost->compressed_base < node->compressed_base);

	// Add the new node after the rightmost node. It's the correct
	// place due to the reason above.
	tree->rightmost->right = node;
	tree->rightmost = node;

	// Balance the AVL-tree if needed. We don't need to keep the balance
	// factors in nodes, because we always fill the tree sequentially,
	// and thus know the state of the tree just by looking at the node
	// count. From the node count we can calculate how many steps to go
	// up in the tree to find the rotation root.
	uint32_t up = tree->count ^ (UINT32_C(1) << bsr32(tree->count));
	if (up != 0) {
		// Locate the root node for the rotation.
		up = ctz32(tree->count) + 2;
		do {
			node = node->parent;
			#ifdef __clang_analyzer__
			assert(node);
			#endif
		} while (--up > 0);

		// Rotate left using node as the rotation root.
		index_tree_node *pivot = node->right;

		if (node->parent == NULL) {
			tree->root = pivot;
		} else {
			assert(node->parent->right == node);
			node->parent->right = pivot;
		}

		pivot->parent = node->parent;

		node->right = pivot->left;
		if (node->right != NULL)
			node->right->parent = node;

		pivot->left = node;
		node->parent = pivot;
	}

	return;
}